

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1f29eed::SatdLpTest_Random_Test::TestBody(SatdLpTest_Random_Test *this)

{
  pointer *__ptr;
  int iVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  AssertHelper local_20;
  
  iVar1 = (this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_
  ;
  if (iVar1 < 0x100) {
    if (iVar1 == 0x10) {
      iVar1 = 0x321f2;
    }
    else {
      if (iVar1 != 0x40) {
LAB_0071835b:
        testing::Message::Message((Message *)&local_28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_28._M_head_impl + 0x10),"Invalid satd size (",0x13);
        std::ostream::operator<<
                  (local_28._M_head_impl + 0x10,
                   (this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
                   satd_size_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_28._M_head_impl + 0x10),") valid: 16/64/256/1024",0x17);
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
                   ,0x448,"Failed");
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
        return;
      }
      iVar1 = 0x10ff5e;
    }
  }
  else if (iVar1 == 0x100) {
    iVar1 = 0x41217f;
  }
  else {
    if (iVar1 != 0x400) goto LAB_0071835b;
    iVar1 = 0x102b2e2;
  }
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this);
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::Check
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this,iVar1);
  return;
}

Assistant:

TEST_P(SatdLpTest, Random) {
  int expected;
  switch (satd_size_) {
    case 16: expected = 205298; break;
    case 64: expected = 1113950; break;
    case 256: expected = 4268415; break;
    case 1024: expected = 16954082; break;
    default:
      FAIL() << "Invalid satd size (" << satd_size_
             << ") valid: 16/64/256/1024";
  }
  FillRandom();
  Check(expected);
}